

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
DictionaryInstance::op_associateValue_withKey
          (string *__return_storage_ptr__,DictionaryInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  __shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 *puVar1;
  allocator local_39;
  shared_ptr<Instance> key;
  shared_ptr<Instance> value;
  
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == 0x40) {
    get_shared_instance((string *)&value,&this->_value_type);
    get_shared_instance((string *)&key,&this->_key_type);
    this_00 = &std::
               map<std::shared_ptr<Instance>,_std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>_>
               ::operator[](&this->_value,&key)->
               super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,&value.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>);
    std::__cxx11::string::string((string *)__return_storage_ptr__,"null",&local_39);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&key.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&value.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return __return_storage_ptr__;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "RuntimeError: wrong number of arguments.";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

std::string DictionaryInstance::op_associateValue_withKey(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> value = get_shared_instance(_value_type, arguments[0]);
    std::shared_ptr<Instance> key = get_shared_instance(_key_type, arguments[1]);
    _value[key] = value;
    return "null";
}